

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CustomExternalWrapperObject.cpp
# Opt level: O2

void * __thiscall Js::CustomExternalWrapperObject::GetSlotData(CustomExternalWrapperObject *this)

{
  WriteBarrierPtr<void> local_18;
  
  if (this->slotType == External) {
    local_18.ptr = this;
    Memory::WriteBarrierPtr<void>::WriteBarrierSet(&local_18,(void *)this->u);
    return (CustomExternalWrapperObject *)local_18.ptr;
  }
  return this + 1;
}

Assistant:

void * CustomExternalWrapperObject::GetSlotData() const
{
    return this->slotType == SlotType::External
        ? unsafe_write_barrier_cast<void *>(this->u.slot)
        : GetInlineSlots();
}